

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieCec.c
# Opt level: O0

int Abc_NtkDeriveFlatGiaSop(Gia_Man_t *pGia,int *gFanins,char *pSop)

{
  int iVar1;
  int iVar2;
  int iLit1;
  bool bVar3;
  int local_38;
  int nFanins;
  int Value;
  int i;
  int gSum;
  int gAnd;
  char *pCube;
  char *pSop_local;
  int *gFanins_local;
  Gia_Man_t *pGia_local;
  
  iVar1 = Abc_SopGetVarNum(pSop);
  iVar2 = Abc_SopIsExorType(pSop);
  if (iVar2 == 0) {
    Value = 0;
    for (_gSum = pSop; *_gSum != '\0'; _gSum = _gSum + (iVar1 + 3)) {
      i = 1;
      nFanins = 0;
      while( true ) {
        bVar3 = false;
        if (_gSum[nFanins] != ' ') {
          local_38 = (int)_gSum[nFanins];
          bVar3 = local_38 != 0;
        }
        if (!bVar3) break;
        if (local_38 == 0x31) {
          i = Gia_ManHashAnd(pGia,i,gFanins[nFanins]);
        }
        else if (local_38 == 0x30) {
          iVar2 = Abc_LitNot(gFanins[nFanins]);
          i = Gia_ManHashAnd(pGia,i,iVar2);
        }
        nFanins = nFanins + 1;
      }
      iVar2 = Abc_LitNot(Value);
      iLit1 = Abc_LitNot(i);
      iVar2 = Gia_ManHashAnd(pGia,iVar2,iLit1);
      Value = Abc_LitNot(iVar2);
    }
  }
  else {
    Value = 0;
    for (nFanins = 0; nFanins < iVar1; nFanins = nFanins + 1) {
      Value = Gia_ManHashXor(pGia,Value,gFanins[nFanins]);
    }
  }
  iVar1 = Abc_SopIsComplement(pSop);
  if (iVar1 != 0) {
    Value = Abc_LitNot(Value);
  }
  return Value;
}

Assistant:

int Abc_NtkDeriveFlatGiaSop( Gia_Man_t * pGia, int * gFanins, char * pSop )
{
    char * pCube;
    int gAnd, gSum;
    int i, Value, nFanins;
    // get the number of variables
    nFanins = Abc_SopGetVarNum(pSop);
    if ( Abc_SopIsExorType(pSop) )
    {
        gSum = 0; 
        for ( i = 0; i < nFanins; i++ )
            gSum = Gia_ManHashXor( pGia, gSum, gFanins[i] );
    }
    else
    {
        // go through the cubes of the node's SOP
        gSum = 0; 
        Abc_SopForEachCube( pSop, nFanins, pCube )
        {
            // create the AND of literals
            gAnd = 1;
            Abc_CubeForEachVar( pCube, Value, i )
            {
                if ( Value == '1' )
                    gAnd = Gia_ManHashAnd( pGia, gAnd, gFanins[i] );
                else if ( Value == '0' )
                    gAnd = Gia_ManHashAnd( pGia, gAnd, Abc_LitNot(gFanins[i]) );
            }
            // add to the sum of cubes
            gSum = Gia_ManHashAnd( pGia, Abc_LitNot(gSum), Abc_LitNot(gAnd) );
            gSum = Abc_LitNot( gSum );
        }
    }
    // decide whether to complement the result
    if ( Abc_SopIsComplement(pSop) )
        gSum = Abc_LitNot(gSum);
    return gSum;
}